

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgt__push_texture(djg_texture *head,djg_texture *texture,bool flipy)

{
  int iVar1;
  djg_texture *pdVar2;
  undefined7 in_register_00000011;
  size_t __n;
  char *__src;
  int iVar3;
  int iVar4;
  char *__src_00;
  int iVar5;
  undefined1 local_78 [72];
  
  if (((int)CONCAT71(in_register_00000011,flipy) != 0) && (iVar4 = texture->x, 0 < iVar4)) {
    __n = (long)texture->pf * (long)texture->comp;
    iVar1 = texture->y;
    iVar3 = 0;
    do {
      if (1 < iVar1) {
        iVar4 = 0;
        iVar5 = -1;
        do {
          __src_00 = texture->texels + (texture->x * iVar4 + iVar3) * (int)__n;
          __src = texture->texels + ((iVar1 + iVar5) * texture->x + iVar3) * (int)__n;
          memcpy(local_78,__src_00,__n);
          memcpy(__src_00,__src,__n);
          memcpy(__src,local_78,__n);
          iVar4 = iVar4 + 1;
          iVar1 = texture->y;
          iVar5 = iVar5 + -1;
        } while (iVar4 < iVar1 / 2);
        iVar4 = texture->x;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < iVar4);
  }
  do {
    pdVar2 = head;
    head = pdVar2->next;
  } while (pdVar2->next != (djg_texture *)0x0);
  pdVar2->next = texture;
  return SUB81(pdVar2,0);
}

Assistant:

static bool
djgt__push_texture(djg_texture *head, djg_texture *texture, bool flipy)
{
    djg_texture *tail = head;

    if (flipy) djgt__flipy(texture);
    while (tail->next) tail = tail->next;
    tail->next = texture;

    return true;
}